

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double derivative_in_direction<sparse_parameters>
                 (vw *param_1,bfgs *b,float *mem,int *origin,sparse_parameters *weights)

{
  float fVar1;
  bool bVar2;
  uint32_t uVar3;
  float *pfVar4;
  int *in_RCX;
  int __c;
  sparse_parameters *in_RDX;
  long in_RSI;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *__s;
  sparse_parameters *in_R8;
  iterator iVar5;
  float *mem1;
  iterator w;
  double ret;
  sparse_iterator<float> *in_stack_ffffffffffffff68;
  sparse_parameters *in_stack_ffffffffffffff70;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_60;
  uint32_t local_58;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_50;
  uint32_t local_48;
  sparse_iterator<float> local_40;
  double local_30;
  sparse_parameters *local_28;
  int *local_20;
  sparse_parameters *local_18;
  long local_10;
  
  local_30 = 0.0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar5 = sparse_parameters::begin(in_stack_ffffffffffffff70);
  local_50._M_cur =
       (__node_type *)
       iVar5._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur;
  local_48 = iVar5._stride;
  local_40._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_50._M_cur;
  local_40._stride = local_48;
  while( true ) {
    iVar5 = sparse_parameters::end(in_stack_ffffffffffffff70);
    local_60._M_cur =
         (__node_type *)
         iVar5._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_58 = iVar5._stride;
    __s = &local_60;
    bVar2 = sparse_iterator<float>::operator!=
                      ((sparse_iterator<float> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                      );
    if (!bVar2) break;
    in_stack_ffffffffffffff70 = local_18;
    in_stack_ffffffffffffff68 =
         (sparse_iterator<float> *)sparse_iterator<float>::index(&local_40,(char *)__s,__c);
    uVar3 = sparse_parameters::stride_shift(local_28);
    fVar1 = *(float *)((long)&(in_stack_ffffffffffffff70->_map)._M_h._M_buckets +
                      (long)(*local_20 % *(int *)(local_10 + 0xb4)) * 4 +
                      ((ulong)in_stack_ffffffffffffff68 >> ((byte)uVar3 & 0x3f)) *
                      (long)*(int *)(local_10 + 0xb4) * 4);
    pfVar4 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x24708f);
    local_30 = (double)fVar1 * (double)pfVar4[2] + local_30;
    sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_ffffffffffffff70);
  }
  return local_30;
}

Assistant:

double derivative_in_direction(vw& /* all */, bfgs& b, float* mem, int& origin, T& weights)
{
  double ret = 0.;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    ret += ((double)mem1[(MEM_GT + origin) % b.mem_stride]) * (&(*w))[W_DIR];
  }
  return ret;
}